

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

void Unr_ManSetup_rec(Unr_Man_t *p,int iObj,int iTent,Vec_Int_t *vRoots)

{
  Gia_Man_t *p_00;
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  
  iVar1 = Vec_IntEntry(p->vTents,iObj);
  if (-1 < iVar1) {
    return;
  }
  Vec_IntWriteEntry(p->vTents,iObj,iTent);
  pGVar3 = Gia_ManObj(p->pGia,iObj);
  if ((~(uint)*(undefined8 *)pGVar3 & 0x1fffffff) == 0) {
LAB_004aeb9a:
    iVar1 = Gia_ObjIsRo(p->pGia,pGVar3);
    if (iVar1 == 0) goto LAB_004aec1f;
    p_00 = p->pGia;
    pGVar3 = Gia_ObjRoToRi(p_00,pGVar3);
    iVar4 = Gia_ObjId(p_00,pGVar3);
    Vec_IntPush(vRoots,iVar4);
    pVVar5 = p->vRanks;
    iVar1 = 0;
  }
  else {
    iVar4 = iObj - ((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
    Unr_ManSetup_rec(p,iVar4,iTent,vRoots);
    pVVar5 = p->vRanks;
    uVar2 = Vec_IntEntry(p->vTents,iVar4);
    iVar1 = ~uVar2 + iTent;
    if ((int)(~uVar2 + iTent) < 1) {
      iVar1 = 0;
    }
    Vec_IntWriteMaxEntry(pVVar5,iVar4,iVar1);
    uVar2 = (uint)*(undefined8 *)pGVar3;
    if ((int)uVar2 < 0 || (~uVar2 & 0x1fffffff) == 0) goto LAB_004aeb9a;
    iVar4 = iObj - ((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff);
    Unr_ManSetup_rec(p,iVar4,iTent,vRoots);
    pVVar5 = p->vRanks;
    uVar2 = Vec_IntEntry(p->vTents,iVar4);
    iVar1 = 0;
    if (0 < (int)(iTent + ~uVar2)) {
      iVar1 = iTent + ~uVar2;
    }
  }
  Vec_IntWriteMaxEntry(pVVar5,iVar4,iVar1);
LAB_004aec1f:
  Vec_IntPush(p->vOrder,iObj);
  return;
}

Assistant:

void Unr_ManSetup_rec( Unr_Man_t * p, int iObj, int iTent, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    int iFanin;
    if ( Vec_IntEntry(p->vTents, iObj) >= 0 )
        return;
    Vec_IntWriteEntry(p->vTents, iObj, iTent);
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId0(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId1(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        Vec_IntPush( vRoots, (iFanin = Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj))) );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, 0 );
    }
    Vec_IntPush( p->vOrder, iObj );
}